

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark.cc
# Opt level: O3

Benchmark * __thiscall
benchmark::internal::Benchmark::Args(Benchmark *this,vector<int,_std::allocator<int>_> *args)

{
  pointer pvVar1;
  ulong uVar2;
  CheckHandler CStack_18;
  
  pvVar1 = (this->imp_->args_).
           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (((pvVar1 != (this->imp_->args_).
                  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish) &&
      (uVar2 = (long)(pvVar1->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)(pvVar1->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                     super__Vector_impl_data._M_start, (int)(~uVar2 >> 2) != 0)) &&
     ((int)(uVar2 >> 2) !=
      (int)((ulong)((long)(args->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                          super__Vector_impl_data._M_finish -
                   (long)(args->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                         super__Vector_impl_data._M_start) >> 2))) {
    CheckHandler::CheckHandler
              (&CStack_18,
               "imp_->ArgsCnt() == -1 || imp_->ArgsCnt() == static_cast<int>(args.size())",
               "/workspace/llm4binary/github/license_c_cmakelists/jtomschroeder[P]lambda/vendor/benchmark/src/benchmark.cc"
               ,"Args",0x2c0);
    CheckHandler::~CheckHandler(&CStack_18);
  }
  GetNullLogInstance();
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::push_back(&this->imp_->args_,args);
  return this;
}

Assistant:

Benchmark* Benchmark::Args(const std::vector<int>& args) {
  CHECK(imp_->ArgsCnt() == -1 || imp_->ArgsCnt() == static_cast<int>(args.size()));
  imp_->Args(args);
  return this;
}